

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

Group * __thiscall adios2::core::Group::InquireGroup(Group *this,string *groupName)

{
  int iVar1;
  element_type *peVar2;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<adios2::core::Group> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  size_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  IO *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [48];
  
  iVar1 = std::__cxx11::string::compare((char *)in_RDI);
  if (iVar1 != 0) {
    __lhs = &local_50;
    std::operator+(in_RDI,(char)((ulong)in_RSI >> 0x38));
    std::operator+(__lhs,in_stack_ffffffffffffff70);
    std::__cxx11::string::operator=(in_RSI,local_30);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::make_shared<adios2::core::Group,std::__cxx11::string&,char&,adios2::core::IO&>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::shared_ptr<adios2::core::Group>::operator=
            ((shared_ptr<adios2::core::Group> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68)
  ;
  std::shared_ptr<adios2::core::Group>::~shared_ptr((shared_ptr<adios2::core::Group> *)0x96cb03);
  this_00 = &in_RDI[1]._M_string_length;
  std::__shared_ptr_access<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x96cb1d);
  std::shared_ptr<adios2::core::Group::TreeMap>::operator=
            ((shared_ptr<adios2::core::Group::TreeMap> *)this_00,
             (shared_ptr<adios2::core::Group::TreeMap> *)in_stack_ffffffffffffff68);
  peVar2 = std::__shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&in_RDI[2].field_2 + 8));
  return peVar2;
}

Assistant:

Group *Group::InquireGroup(std::string groupName)
{
    if (currentPath.compare("") != 0)
    {
        groupName = currentPath + groupDelimiter + groupName;
    }
    m_Gr = std::make_shared<Group>(groupName, this->groupDelimiter, this->m_IO);
    m_Gr->mapPtr = this->mapPtr;
    return m_Gr.get();
}